

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast_operators.cpp
# Opt level: O1

bool __thiscall
duckdb::HugeIntCastData<duckdb::hugeint_t,_duckdb::Hugeint,_long>::FlushDecimal
          (HugeIntCastData<duckdb::hugeint_t,_duckdb::Hugeint,_long> *this)

{
  ResultType *pRVar1;
  hugeint_t lhs;
  bool bVar2;
  undefined7 extraout_var;
  long lVar3;
  ulong in_RCX;
  hugeint_t rhs;
  hugeint_t local_28;
  
  if (this->decimal_intermediate_digits == 0) {
    hugeint_t::hugeint_t(&local_28,0);
    bVar2 = hugeint_t::operator==(&this->decimal_intermediate,&local_28);
    in_RCX = CONCAT71(extraout_var,bVar2) & 0xffffffff;
    if ((char)in_RCX != '\0') {
      return true;
    }
  }
  pRVar1 = &this->decimal;
  lhs.lower = pRVar1->lower;
  lhs.upper = pRVar1->upper;
  if (pRVar1->lower != 0 || (this->decimal).upper != 0) {
    if (0x26 < this->decimal_intermediate_digits) {
      return false;
    }
    lVar3 = (ulong)this->decimal_intermediate_digits * 0x10;
    in_RCX = *(ulong *)(Hugeint::POWERS_OF_TEN + lVar3 + 8);
    bVar2 = Hugeint::TryMultiply(lhs,*(hugeint_t *)(Hugeint::POWERS_OF_TEN + lVar3),&this->decimal);
    if (!bVar2) {
      return false;
    }
  }
  rhs.upper = in_RCX;
  rhs.lower = (this->decimal_intermediate).upper;
  bVar2 = Hugeint::TryAddInPlace
                    ((Hugeint *)&this->decimal,(hugeint_t *)(this->decimal_intermediate).lower,rhs);
  if (!bVar2) {
    return false;
  }
  this->decimal_total_digits = this->decimal_total_digits + this->decimal_intermediate_digits;
  this->decimal_intermediate_digits = 0;
  hugeint_t::hugeint_t(&local_28,0);
  (this->decimal_intermediate).lower = local_28.lower;
  (this->decimal_intermediate).upper = local_28.upper;
  return true;
}

Assistant:

bool FlushDecimal() {
		if (decimal_intermediate_digits == 0 && decimal_intermediate == 0) {
			return true;
		}
		if (decimal.lower != 0 || decimal.upper != 0) {
			if (decimal_intermediate_digits > 38) {
				return false;
			}
			if (!OP::TryMultiply(decimal, OP::POWERS_OF_TEN[decimal_intermediate_digits], decimal)) {
				return false;
			}
		}
		if (!OP::TryAddInPlace(decimal, ResultType(decimal_intermediate))) {
			return false;
		}
		decimal_total_digits += decimal_intermediate_digits;
		decimal_intermediate_digits = 0;
		decimal_intermediate = 0;
		return true;
	}